

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hpp
# Opt level: O2

wstring * __thiscall
Centaurus::Stream::cut(wstring *__return_storage_ptr__,Stream *this,Sentry *sentry)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  
  pwVar1 = sentry->_M_current;
  pwVar2 = (this->m_cur)._M_current;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::wstring::
  _M_construct<__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>>
            ((wstring *)__return_storage_ptr__,pwVar1,pwVar2);
  return __return_storage_ptr__;
}

Assistant:

std::wstring cut(const Sentry& sentry)
    {
        return std::wstring(static_cast<std::wstring::const_iterator>(sentry), static_cast<std::wstring::const_iterator>(m_cur));
    }